

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O0

Identity * __thiscall CoreML::Specification::Model::mutable_identity(Model *this)

{
  bool bVar1;
  Identity *this_00;
  Model *this_local;
  
  bVar1 = has_identity(this);
  if (!bVar1) {
    clear_Type(this);
    set_has_identity(this);
    this_00 = (Identity *)operator_new(0x18);
    Identity::Identity(this_00);
    (this->Type_).identity_ = this_00;
  }
  return (Identity *)(this->Type_).pipelineclassifier_;
}

Assistant:

inline ::CoreML::Specification::Identity* Model::mutable_identity() {
  if (!has_identity()) {
    clear_Type();
    set_has_identity();
    Type_.identity_ = new ::CoreML::Specification::Identity;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.identity)
  return Type_.identity_;
}